

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

FBaseCVar * GetUserCVar(int playernum,char *cvarname)

{
  FBaseCVar *pFVar1;
  long *plVar2;
  uint uVar3;
  ulong uVar4;
  long *plVar5;
  
  if (7 < (uint)playernum) {
    return (FBaseCVar *)0x0;
  }
  uVar4 = (ulong)(uint)playernum;
  if (playeringame[uVar4] == true) {
    uVar3 = FName::NameManager::FindName(&FName::NameData,cvarname,true);
    plVar2 = (long *)((ulong)((&DAT_00a602d8)[uVar4 * 0xa8] - 1 & uVar3) * 0x18 +
                     (&DAT_00a602c8)[uVar4 * 0x54]);
    do {
      plVar5 = plVar2;
      if (plVar5 == (long *)0x0) {
        return (FBaseCVar *)0x0;
      }
      if ((long *)*plVar5 == (long *)0x1) {
        return (FBaseCVar *)0x0;
      }
      plVar2 = (long *)*plVar5;
    } while (*(uint *)(plVar5 + 1) != uVar3);
    pFVar1 = (FBaseCVar *)plVar5[2];
    if (pFVar1 != (FBaseCVar *)0x0) {
      if ((pFVar1->Flags & 0x4000) != 0) {
        return (FBaseCVar *)0x0;
      }
      return pFVar1;
    }
  }
  return (FBaseCVar *)0x0;
}

Assistant:

FBaseCVar *GetUserCVar(int playernum, const char *cvarname)
{
	if ((unsigned)playernum >= MAXPLAYERS || !playeringame[playernum])
	{
		return nullptr;
	}
	FBaseCVar **cvar_p = players[playernum].userinfo.CheckKey(FName(cvarname, true));
	FBaseCVar *cvar;
	if (cvar_p == nullptr || (cvar = *cvar_p) == nullptr || (cvar->GetFlags() & CVAR_IGNORE))
	{
		return nullptr;
	}
	return cvar;
}